

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontStructMatrix.cpp
# Opt level: O3

void __thiscall
TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
::OrderElement(TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
               *this)

{
  int iVar1;
  long lVar2;
  TPZCompEl *pTVar3;
  long lVar4;
  int *piVar5;
  TPZConnect *pTVar6;
  TPZCompEl **ppTVar7;
  TPZCompMesh *pTVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  TPZVec<long> firstelconnect;
  TPZVec<long> elconnect;
  TPZVec<long> elorderinv;
  TPZVec<int> nodeorder;
  TPZVec<long> local_108;
  TPZVec<long> local_e8;
  TPZVec<long> local_c8;
  long local_a8;
  TPZManVector<long,_10> local_a0;
  
  lVar2 = (((this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.fMesh)->
          fConnectVec).super_TPZChunkVector<TPZConnect,_10>.fNElements;
  TPZVec<long>::TPZVec(&local_108,lVar2 + 1);
  *local_108.fStore = 0;
  lVar11 = 0;
  if (0 < lVar2) {
    lVar12 = 0;
    do {
      pTVar6 = TPZChunkVector<TPZConnect,_10>::operator[]
                         (&(((this->super_TPZStructMatrixT<std::complex<double>_>).
                             super_TPZStructMatrix.fMesh)->fConnectVec).
                           super_TPZChunkVector<TPZConnect,_10>,lVar12);
      iVar1 = pTVar6->fNElConnected;
      lVar10 = local_108.fStore[lVar12];
      pTVar6 = TPZChunkVector<TPZConnect,_10>::operator[]
                         (&(((this->super_TPZStructMatrixT<std::complex<double>_>).
                             super_TPZStructMatrix.fMesh)->fConnectVec).
                           super_TPZChunkVector<TPZConnect,_10>,lVar12);
      lVar11 = lVar11 + iVar1;
      local_108.fStore[lVar12 + 1] = lVar10 + pTVar6->fNElConnected;
      lVar12 = lVar12 + 1;
    } while (lVar2 != lVar12);
  }
  local_a0.super_TPZVec<long>._vptr_TPZVec = (_func_int **)0xffffffffffffffff;
  TPZVec<long>::TPZVec(&local_e8,lVar11,(long *)&local_a0);
  pTVar8 = (this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.fMesh;
  if (0 < (pTVar8->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements) {
    lVar11 = 0;
    do {
      ppTVar7 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (&(pTVar8->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,lVar11);
      pTVar3 = *ppTVar7;
      if (pTVar3 != (TPZCompEl *)0x0) {
        TPZStack<long,_10>::TPZStack((TPZStack<long,_10> *)&local_a0);
        (**(code **)(*(long *)pTVar3 + 0x1e0))(pTVar3,&local_a0);
        if (0 < local_a0.super_TPZVec<long>.fNElements) {
          lVar12 = 0;
          do {
            lVar10 = local_a0.super_TPZVec<long>.fStore[lVar12];
            local_e8.fStore[local_108.fStore[lVar10]] = lVar11;
            local_108.fStore[lVar10] = local_108.fStore[lVar10] + 1;
            lVar12 = lVar12 + 1;
          } while (local_a0.super_TPZVec<long>.fNElements != lVar12);
        }
        TPZManVector<long,_10>::~TPZManVector(&local_a0);
      }
      lVar11 = lVar11 + 1;
      pTVar8 = (this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.fMesh;
    } while (lVar11 < (pTVar8->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements);
  }
  *local_108.fStore = 0;
  if (0 < lVar2) {
    lVar12 = 0;
    lVar11 = 0;
    do {
      pTVar6 = TPZChunkVector<TPZConnect,_10>::operator[]
                         (&(((this->super_TPZStructMatrixT<std::complex<double>_>).
                             super_TPZStructMatrix.fMesh)->fConnectVec).
                           super_TPZChunkVector<TPZConnect,_10>,lVar11);
      lVar12 = lVar12 + pTVar6->fNElConnected;
      local_108.fStore[lVar11 + 1] = lVar12;
      lVar11 = lVar11 + 1;
    } while (lVar2 != lVar11);
    pTVar8 = (this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.fMesh;
  }
  local_a0.super_TPZVec<long>._vptr_TPZVec._0_4_ = 0xffffffff;
  TPZVec<int>::Resize(&this->fElementOrder,
                      (pTVar8->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements,
                      (int *)&local_a0);
  local_a0.super_TPZVec<long>._vptr_TPZVec =
       (_func_int **)CONCAT44(local_a0.super_TPZVec<long>._vptr_TPZVec._4_4_,0xffffffff);
  TPZVec<int>::Fill(&this->fElementOrder,(int *)&local_a0,0,-1);
  local_c8._vptr_TPZVec = (_func_int **)CONCAT44(local_c8._vptr_TPZVec._4_4_,0xffffffff);
  TPZVec<int>::TPZVec((TPZVec<int> *)&local_a0,
                      (((this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.
                       fMesh)->fConnectVec).super_TPZChunkVector<TPZConnect,_10>.fNElements,
                      (int *)&local_c8);
  *local_108.fStore = 0;
  if (0 < lVar2) {
    lVar11 = 0;
    do {
      pTVar6 = TPZChunkVector<TPZConnect,_10>::operator[]
                         (&(((this->super_TPZStructMatrixT<std::complex<double>_>).
                             super_TPZStructMatrix.fMesh)->fConnectVec).
                           super_TPZChunkVector<TPZConnect,_10>,lVar11);
      if (-1 < pTVar6->fSequenceNumber) {
        *(int *)((long)local_a0.super_TPZVec<long>.fStore + pTVar6->fSequenceNumber * 4) =
             (int)lVar11;
      }
      lVar11 = lVar11 + 1;
    } while (lVar2 != lVar11);
  }
  local_a8 = -1;
  TPZVec<long>::TPZVec
            (&local_c8,
             (((this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.fMesh)->
             fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements,&local_a8);
  if (0 < lVar2) {
    lVar11 = 0;
    lVar12 = 0;
    do {
      lVar10 = (long)*(int *)((long)local_a0.super_TPZVec<long>.fStore + lVar12 * 4);
      if (lVar10 != -1) {
        lVar9 = local_108.fStore[lVar10];
        lVar10 = local_108.fStore[lVar10 + 1];
        if (lVar9 < lVar10) {
          do {
            lVar4 = local_e8.fStore[lVar9];
            if ((lVar4 != -1) && (local_c8.fStore[lVar4] == -1)) {
              local_c8.fStore[lVar4] = lVar11;
              lVar11 = lVar11 + 1;
            }
            lVar9 = lVar9 + 1;
          } while (lVar10 != lVar9);
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != lVar2);
  }
  lVar2 = (((this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.fMesh)->
          fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  if (lVar2 < 1) {
    local_c8._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
    if (local_c8.fStore == (long *)0x0) goto LAB_01372d0a;
  }
  else {
    piVar5 = (this->fElementOrder).fStore;
    lVar11 = 0;
    do {
      if (local_c8.fStore[lVar11] != -1) {
        piVar5[local_c8.fStore[lVar11]] = (int)lVar11;
      }
      lVar11 = lVar11 + 1;
    } while (lVar2 != lVar11);
  }
  local_c8._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
  operator_delete__(local_c8.fStore);
LAB_01372d0a:
  local_a0.super_TPZVec<long>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
  if (local_a0.super_TPZVec<long>.fStore != (long *)0x0) {
    operator_delete__(local_a0.super_TPZVec<long>.fStore);
  }
  local_e8._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
  if (local_e8.fStore != (long *)0x0) {
    operator_delete__(local_e8.fStore);
  }
  local_108._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
  if (local_108.fStore != (long *)0x0) {
    operator_delete__(local_108.fStore);
  }
  return;
}

Assistant:

void TPZFrontStructMatrix<TFront,TVar,TPar>::OrderElement()//TPZVec<int> &elorder)
{
	int64_t numelconnected = 0;
	int64_t nconnect = this->fMesh->ConnectVec().NElements();
	int64_t ic;
	//firstelconnect contains the first element index in the elconnect vector
	TPZVec<int64_t> firstelconnect(nconnect+1);
	firstelconnect[0] = 0;
	for(ic=0; ic<nconnect; ic++) {
		numelconnected += this->fMesh->ConnectVec()[ic].NElConnected();
		firstelconnect[ic+1] = firstelconnect[ic]+this->fMesh->ConnectVec()[ic].NElConnected();
	}
#ifdef PZDEBUG
    TPZVec<int64_t> firstel_copy(firstelconnect);
#endif
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout<<"numelconnected " << numelconnected << endl;
		sout<< "firstelconnect "<< firstelconnect;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	//cout << "numelconnected " << numelconnected << endl;
	//cout << "firstelconnect ";
	//  for(ic=0; ic<nconnect; ic++) cout << firstelconnect[ic] << ' ';
  	TPZVec<int64_t> elconnect(numelconnected,-1);
  	int64_t el;
  	TPZCompEl *cel;
  	for(el=0; el<this->fMesh->ElementVec().NElements(); el++) {
  		cel = this->fMesh->ElementVec()[el];
  		if(!cel) continue;
  		TPZStack<int64_t> connectlist;
  		cel->BuildConnectList(connectlist);
  		int64_t nc = connectlist.NElements();
  		int64_t ic;
  		for(ic=0; ic<nc; ic++) {
  			int64_t cindex = connectlist[ic];
#ifdef PZDEBUG
            if(firstelconnect[cindex] >= firstel_copy[cindex+1])
            {
                std::cout << "firstelconnect " << firstelconnect << std::endl;
                std::cout << "firstel_copy " << firstel_copy << std::endl;
                DebugStop();
            }
#endif
  			elconnect[firstelconnect[cindex]] = el;
  			firstelconnect[cindex]++;
  		}
  	}
	//  for(ic=0; ic<numelconnected; ic++) cout << elconnect[ic] << endl;
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout<< "elconnect "<< elconnect;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
  	firstelconnect[0] = 0;
  	for(ic=0; ic<nconnect; ic++) {
  		firstelconnect[ic+1] = firstelconnect[ic]+this->fMesh->ConnectVec()[ic].NElConnected();
  	}
	//cout << "elconnect\n";
	//  int no;
	for(int64_t no=0; no< this->fMesh->ConnectVec().NElements(); no++) {
#ifdef PZ_LOG
        if (logger.isDebugEnabled())
		{
			std::stringstream sout;
			sout<< "Node index " << no << ' ' << " seq num " << this->fMesh->ConnectVec()[no].SequenceNumber() << ' ';
			LOGPZ_DEBUG(logger,sout.str())
		}
#endif
		//cout << "no numero " << no << ' ' << " seq num " << this->fMesh->ConnectVec()[no].SequenceNumber() << ' ';
		//       for(ic=firstelconnect[no]; ic<firstelconnect[no+1];ic++) cout << elconnect[ic] << ' ';
		//cout << endl;
	}
	
	
  	fElementOrder.Resize(this->fMesh->ElementVec().NElements(),-1);
  	fElementOrder.Fill(-1);
  	TPZVec<int> nodeorder(this->fMesh->ConnectVec().NElements(),-1);
  	firstelconnect[0] = 0;
  	for(ic=0; ic<nconnect; ic++) {
  		int64_t seqnum = this->fMesh->ConnectVec()[ic].SequenceNumber();
  		if(seqnum >= 0) nodeorder[seqnum] = ic;
  	}
	//  cout << "nodeorder ";
	/*for(ic=0; ic<this->fMesh->ConnectVec().NElements(); ic++) cout << nodeorder[ic] << ' ';
	 cout << endl;
	 cout.flush();*/
  	int64_t seq;
  	int64_t elsequence = 0;
  	TPZVec<int64_t> elorderinv(this->fMesh->ElementVec().NElements(),-1);
  	for(seq=0; seq<nconnect; seq++) {
  		ic = nodeorder[seq];
  		if(ic == -1) continue;
  		int64_t firstind = firstelconnect[ic];
  		int64_t lastind = firstelconnect[ic+1];
  		int64_t ind;
  		for(ind=firstind; ind<lastind; ind++) {
  			el = elconnect[ind];
			if(el == -1) {
				continue;
			}
  			if(elorderinv[el]==-1) elorderinv[el] = elsequence++;
  		}
  	}
	//  cout << "elorderinv ";
	//  for(seq=0;seq<this->fMesh->ElementVec().NElements();seq++) cout << elorderinv[seq] << ' ';
	//  cout << endl;
  	elsequence = 0;
  	for(seq=0;seq<this->fMesh->ElementVec().NElements();seq++) {
  		if(elorderinv[seq] == -1) continue;
  		fElementOrder[elorderinv[seq]] = seq;
  	}
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	{
		std::stringstream sout;
        sout << "element order " << fElementOrder << std::endl;
		sout<< "elorderinv " << elorderinv << std::endl;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	//  cout << "elorder" << endl;
	//  for(ic=0; ic<this->fMesh->ElementVec().NElements(); ic++) cout << elorder[ic] << endl;
	
}